

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

void binbuf_savetext(_binbuf *bfrom,_binbuf *bto)

{
  char *pcVar1;
  char *pcVar2;
  t_atom *argv;
  long lVar3;
  t_atom *a;
  t_atom at;
  char buf [1001];
  t_atom local_438;
  t_atom local_428 [63];
  
  lVar3 = (long)bfrom->b_n;
  if (0 < lVar3) {
    a = bfrom->b_vec;
    do {
      argv = a;
      if (a->a_type != A_FLOAT) {
        if (a->a_type == A_SYMBOL) {
          pcVar2 = ((a->a_w).w_symbol)->s_name;
          pcVar1 = strchr(pcVar2,0x3b);
          if (((pcVar1 == (char *)0x0) && (pcVar1 = strchr(pcVar2,0x2c), pcVar1 == (char *)0x0)) &&
             (pcVar2 = strchr(pcVar2,0x24), pcVar2 == (char *)0x0)) goto LAB_0016b937;
        }
        atom_string(a,(char *)local_428,1000);
        local_438.a_type = A_SYMBOL;
        local_438.a_w.w_symbol = gensym((char *)local_428);
        argv = &local_438;
      }
LAB_0016b937:
      binbuf_add(bto,1,argv);
      a = a + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  local_428[0].a_type = A_SEMI;
  local_428[0].a_w.w_float = 0.0;
  binbuf_add(bto,1,local_428);
  return;
}

Assistant:

void binbuf_savetext(const t_binbuf *bfrom, t_binbuf *bto)
{
    int k, n = binbuf_getnatom(bfrom);
    const t_atom *ap = binbuf_getvec(bfrom);
    t_atom at;
    for (k = 0; k < n; k++)
    {
        if (ap[k].a_type == A_FLOAT ||
            (ap[k].a_type == A_SYMBOL &&
                !strchr(ap[k].a_w.w_symbol->s_name, ';') &&
                !strchr(ap[k].a_w.w_symbol->s_name, ',') &&
                !strchr(ap[k].a_w.w_symbol->s_name, '$')))
                    binbuf_add(bto, 1, &ap[k]);
        else
        {
            char buf[MAXPDSTRING+1];
            atom_string(&ap[k], buf, MAXPDSTRING);
            SETSYMBOL(&at, gensym(buf));
            binbuf_add(bto, 1, &at);
        }
    }
    binbuf_addsemi(bto);
}